

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

void __thiscall
InsertProxyModel::setSourceModel(InsertProxyModel *this,QAbstractItemModel *newSourceModel)

{
  bool bVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  Connection *pCVar4;
  Object *sender;
  QList<QMetaObject::Connection> *pQVar5;
  Object *sender_00;
  Function signal;
  Object *pOVar6;
  Object *pOVar7;
  Object *pOVar8;
  Object *pOVar9;
  long *plVar10;
  QList<QMap<int,_QVariant>_> *pQVar11;
  QMap<int,_QVariant> local_328;
  int local_31c;
  QMap<int,_QVariant> QStack_318;
  int i_1;
  int local_30c;
  int i;
  int local_2ec;
  int sourceRows;
  int local_2cc;
  code *pcStack_2c8;
  int sourceCols;
  undefined8 local_2c0;
  Connection *local_2b8;
  Connection local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  InsertProxyModel *local_298;
  Connection local_290;
  code *local_288;
  undefined8 local_280;
  Connection *local_278;
  Connection local_270;
  code *local_268;
  undefined8 local_260;
  Connection *local_258;
  Connection local_250;
  code *local_248;
  undefined8 local_240;
  Connection *local_238;
  Connection local_230;
  code *local_228;
  undefined8 local_220;
  InsertProxyModel *local_218;
  Connection local_210;
  code *local_208;
  undefined8 local_200;
  InsertProxyModel *local_1f8;
  Connection local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  InsertProxyModel *local_1d8;
  Connection local_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  Connection *local_1b8;
  Connection local_1b0;
  code *local_1a8;
  undefined8 local_1a0;
  Connection *local_198;
  Connection local_190;
  code *local_188;
  undefined8 local_180;
  Connection *local_178;
  Connection local_170;
  code *local_168;
  undefined8 local_160;
  InsertProxyModel *local_158;
  Connection local_150;
  code *local_148;
  undefined8 local_140;
  InsertProxyModel *local_138;
  Connection local_130;
  code *local_128;
  undefined8 local_120;
  InsertProxyModel *local_118;
  Connection local_110;
  code *local_108;
  undefined8 local_100;
  Connection *local_f8;
  Connection local_f0;
  code *local_e8;
  undefined8 local_e0;
  Connection *local_d8;
  Connection local_d0;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 local_b0;
  Connection local_a8;
  code *local_a0;
  undefined8 local_98;
  InsertProxyModel *local_90;
  Connection local_88 [3];
  code *local_70;
  undefined8 local_68;
  InsertProxyModel *local_60;
  Connection local_58;
  QList<QMap<int,_QVariant>_> *local_50;
  QList<QMap<int,_QVariant>_> *extraData;
  QList<QMap<int,_QVariant>_> *__end1;
  QList<QMap<int,_QVariant>_> *__begin1;
  QList<QMap<int,_QVariant>_> (*__range1) [2];
  const_iterator local_28;
  const_iterator discIter;
  InsertProxyModelPrivate *d;
  QAbstractItemModel *newSourceModel_local;
  InsertProxyModel *this_local;
  
  pQVar2 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel();
  if (newSourceModel != pQVar2) {
    discIter.i = (Connection *)d_func(this);
    QAbstractItemModel::beginResetModel();
    lVar3 = QAbstractProxyModel::sourceModel();
    if (lVar3 != 0) {
      local_28 = QList<QMetaObject::Connection>::cbegin
                           ((QList<QMetaObject::Connection> *)(discIter.i + 0x17));
      while( true ) {
        __range1 = (QList<QMap<int,_QVariant>_> (*) [2])
                   QList<QMetaObject::Connection>::cend
                             ((QList<QMetaObject::Connection> *)(discIter.i + 0x17));
        bVar1 = QList<QMetaObject::Connection>::const_iterator::operator!=
                          (&local_28,(const_iterator)__range1);
        if (!bVar1) break;
        pCVar4 = QList<QMetaObject::Connection>::const_iterator::operator*(&local_28);
        QObject::disconnect(pCVar4);
        QList<QMetaObject::Connection>::const_iterator::operator++(&local_28);
      }
    }
    QAbstractProxyModel::setSourceModel((QAbstractItemModel *)this);
    QList<QMetaObject::Connection>::clear((QList<QMetaObject::Connection> *)(discIter.i + 0x17));
    extraData = (QList<QMap<int,_QVariant>_> *)(discIter.i + 0x13);
    __end1 = (QList<QMap<int,_QVariant>_> *)(discIter.i + 0xd);
    __begin1 = __end1;
    for (; __end1 != extraData; __end1 = __end1 + 1) {
      local_50 = __end1;
      QList<QMap<int,_QVariant>_>::clear(__end1);
    }
    lVar3 = QAbstractProxyModel::sourceModel();
    if (lVar3 != 0) {
      pQVar5 = (QList<QMetaObject::Connection> *)(discIter.i + 0x17);
      sender = (Object *)QAbstractProxyModel::sourceModel();
      local_70 = QObject::destroyed;
      local_68 = 0;
      local_60 = this;
      QObject::
      connect<void(QObject::*)(QObject*),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__0>
                ((QObject *)&local_58,sender,(offset_in_QObject_to_subr)QObject::destroyed,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,(rvalue_ref)&local_58);
      sender_00 = (Object *)QAbstractProxyModel::sourceModel();
      local_a0 = QAbstractItemModel::dataChanged;
      local_98 = 0;
      local_90 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__1>
                ((QObject *)local_88,sender_00,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::dataChanged,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,local_88);
      signal = QAbstractProxyModel::sourceModel();
      local_b8 = QAbstractItemModel::headerDataChanged;
      local_b0 = 0;
      local_c8 = QAbstractItemModel::headerDataChanged;
      uStack_c0 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(Qt::Orientation,int,int),void(QAbstractItemModel::*)(Qt::Orientation,int,int)>
                ((Object *)&local_a8,signal,(Object *)QAbstractItemModel::headerDataChanged,0,
                 (ConnectionType)this);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_a8);
      pOVar6 = (Object *)QAbstractProxyModel::sourceModel();
      local_d8 = discIter.i;
      local_e8 = QAbstractItemModel::layoutAboutToBeChanged;
      local_e0 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__2>
                ((QObject *)&local_d0,pOVar6,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::layoutAboutToBeChanged,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_d0);
      pOVar6 = (Object *)QAbstractProxyModel::sourceModel();
      local_f8 = discIter.i;
      local_108 = QAbstractItemModel::layoutChanged;
      local_100 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__3>
                ((QObject *)&local_f0,pOVar6,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::layoutChanged,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_f0);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_128 = QAbstractItemModel::columnsAboutToBeInserted;
      local_120 = 0;
      local_118 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__4>
                ((QObject *)&local_110,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::columnsAboutToBeInserted,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_110);
      pOVar8 = (Object *)QAbstractProxyModel::sourceModel();
      local_148 = QAbstractItemModel::columnsAboutToBeMoved;
      local_140 = 0;
      local_138 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__5>
                ((QObject *)&local_130,pOVar8,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::columnsAboutToBeMoved,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_130);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_168 = QAbstractItemModel::columnsAboutToBeRemoved;
      local_160 = 0;
      local_158 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__6>
                ((QObject *)&local_150,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::columnsAboutToBeRemoved,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_150);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_178 = discIter.i;
      local_188 = QAbstractItemModel::columnsInserted;
      local_180 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__7>
                ((QObject *)&local_170,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::columnsInserted,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_170);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_198 = discIter.i;
      local_1a8 = QAbstractItemModel::columnsRemoved;
      local_1a0 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__8>
                ((QObject *)&local_190,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::columnsRemoved,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_190);
      pOVar8 = (Object *)QAbstractProxyModel::sourceModel();
      local_1b8 = discIter.i;
      local_1c8 = QAbstractItemModel::columnsMoved;
      local_1c0 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__9>
                ((QObject *)&local_1b0,pOVar8,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::columnsMoved,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_1b0);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_1e8 = QAbstractItemModel::rowsAboutToBeInserted;
      local_1e0 = 0;
      local_1d8 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__10>
                ((QObject *)&local_1d0,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeInserted,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_1d0);
      pOVar8 = (Object *)QAbstractProxyModel::sourceModel();
      local_208 = QAbstractItemModel::rowsAboutToBeMoved;
      local_200 = 0;
      local_1f8 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__11>
                ((QObject *)&local_1f0,pOVar8,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeMoved,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_1f0);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_228 = QAbstractItemModel::rowsAboutToBeRemoved;
      local_220 = 0;
      local_218 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__12>
                ((QObject *)&local_210,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsAboutToBeRemoved,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_210);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_238 = discIter.i;
      local_248 = QAbstractItemModel::rowsInserted;
      local_240 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__13>
                ((QObject *)&local_230,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsInserted,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_230);
      pOVar7 = (Object *)QAbstractProxyModel::sourceModel();
      local_258 = discIter.i;
      local_268 = QAbstractItemModel::rowsRemoved;
      local_260 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__14>
                ((QObject *)&local_250,pOVar7,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsRemoved,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_250);
      pOVar8 = (Object *)QAbstractProxyModel::sourceModel();
      local_278 = discIter.i;
      local_288 = QAbstractItemModel::rowsMoved;
      local_280 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__15>
                ((QObject *)&local_270,pOVar8,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsMoved,
                 (anon_class_8_1_54a39804_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_270);
      pOVar9 = (Object *)QAbstractProxyModel::sourceModel();
      local_2a8 = QAbstractItemModel::modelAboutToBeReset;
      local_2a0 = 0;
      local_298 = this;
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__16>
                ((QObject *)&local_290,pOVar9,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::modelAboutToBeReset,
                 (anon_class_8_1_8991fb9c_for_function)0x0);
      pQVar5 = QList<QMetaObject::Connection>::operator<<(pQVar5,&local_290);
      pOVar9 = (Object *)QAbstractProxyModel::sourceModel();
      local_2b8 = discIter.i;
      pcStack_2c8 = QAbstractItemModel::modelReset;
      local_2c0 = 0;
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),InsertProxyModel::setSourceModel(QAbstractItemModel*)::__17>
                ((QObject *)&local_2b0,pOVar9,
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::modelReset,
                 (anon_class_8_1_54a39804_for_function)0x0);
      QList<QMetaObject::Connection>::operator<<(pQVar5,&local_2b0);
      QMetaObject::Connection::~Connection(&local_2b0);
      QMetaObject::Connection::~Connection(&local_290);
      QMetaObject::Connection::~Connection(&local_270);
      QMetaObject::Connection::~Connection(&local_250);
      QMetaObject::Connection::~Connection(&local_230);
      QMetaObject::Connection::~Connection(&local_210);
      QMetaObject::Connection::~Connection(&local_1f0);
      QMetaObject::Connection::~Connection(&local_1d0);
      QMetaObject::Connection::~Connection(&local_1b0);
      QMetaObject::Connection::~Connection(&local_190);
      QMetaObject::Connection::~Connection(&local_170);
      QMetaObject::Connection::~Connection(&local_150);
      QMetaObject::Connection::~Connection(&local_130);
      QMetaObject::Connection::~Connection(&local_110);
      QMetaObject::Connection::~Connection(&local_f0);
      QMetaObject::Connection::~Connection(&local_d0);
      QMetaObject::Connection::~Connection(&local_a8);
      QMetaObject::Connection::~Connection(local_88);
      QMetaObject::Connection::~Connection(&local_58);
      plVar10 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex((QModelIndex *)&stack0xfffffffffffffd18);
      local_2cc = (**(code **)(*plVar10 + 0x80))(plVar10,&stack0xfffffffffffffd18);
      plVar10 = (long *)QAbstractProxyModel::sourceModel();
      QModelIndex::QModelIndex((QModelIndex *)&stack0xfffffffffffffcf8);
      local_2ec = (**(code **)(*plVar10 + 0x78))(plVar10,&stack0xfffffffffffffcf8);
      for (local_30c = 0; local_30c < local_2ec; local_30c = local_30c + 1) {
        pQVar11 = (QList<QMap<int,_QVariant>_> *)(discIter.i + 0xd);
        QStack_318.d.d =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                *)0x0;
        QMap<int,_QVariant>::QMap(&stack0xfffffffffffffce8);
        QList<QMap<int,_QVariant>_>::append(pQVar11,&stack0xfffffffffffffce8);
        QMap<int,_QVariant>::~QMap(&stack0xfffffffffffffce8);
      }
      for (local_31c = 0; local_31c < local_2cc; local_31c = local_31c + 1) {
        pQVar11 = (QList<QMap<int,_QVariant>_> *)(discIter.i + 0x10);
        local_328.d.d =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                *)0x0;
        QMap<int,_QVariant>::QMap(&local_328);
        QList<QMap<int,_QVariant>_>::append(pQVar11,&local_328);
        QMap<int,_QVariant>::~QMap(&local_328);
      }
    }
    QAbstractItemModel::endResetModel();
  }
  return;
}

Assistant:

void InsertProxyModel::setSourceModel(QAbstractItemModel *newSourceModel)
{
    if (newSourceModel == sourceModel())
        return;
    Q_D(InsertProxyModel);
    beginResetModel();
    if (sourceModel()) {
        for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
            QObject::disconnect(*discIter);
    }
    QAbstractProxyModel::setSourceModel(newSourceModel);
    d->m_sourceConnections.clear();
    for (auto &extraData : d->m_extraData)
        extraData.clear();
    if (sourceModel()) {
        d->m_sourceConnections
                << QObject::connect(sourceModel(), &QAbstractItemModel::destroyed, [this]() -> void { setSourceModel(Q_NULLPTR); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::dataChanged,
                                    [this](const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles) {
                                        Q_EMIT dataChanged(mapFromSource(topLeft), mapFromSource(bottomRight), roles);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::headerDataChanged, this, &QAbstractItemModel::headerDataChanged)
                << QObject::connect(sourceModel(), &QAbstractItemModel::layoutAboutToBeChanged,
                                    [d](const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint) {
                                        d->beforeLayoutChange(parents, hint);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::layoutChanged,
                                    [d](const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint) {
                                        d->afetrLayoutChange(parents, hint);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeInserted,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginInsertColumns(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeMoved,
                                    [this](const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destinationParent,
                                           int destinationColumn) {
                                        if (sourceParent.isValid())
                                            return;
                                        if (destinationParent.isValid())
                                            beginRemoveColumns(QModelIndex(), sourceStart, sourceEnd);
                                        else
                                            beginMoveColumns(QModelIndex(), sourceStart, sourceEnd, QModelIndex(), destinationColumn);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeRemoved,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginRemoveColumns(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsInserted,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onColumnsInserted(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsRemoved,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onColumnsRemoved(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsMoved,
                                    [d](const QModelIndex &parent, int start, int end, const QModelIndex &destination, int column) -> void {
                                        d->onColumnsMoved(parent, start, end, destination, column);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeInserted,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginInsertRows(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeMoved,
                                    [this](const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destinationParent,
                                           int destinationRow) {
                                        if (sourceParent.isValid())
                                            return;
                                        if (destinationParent.isValid())
                                            beginRemoveRows(QModelIndex(), sourceStart, sourceEnd);
                                        else
                                            beginMoveRows(QModelIndex(), sourceStart, sourceEnd, QModelIndex(), destinationRow);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeRemoved,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginRemoveRows(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsInserted,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onRowsInserted(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsRemoved,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onRowsRemoved(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsMoved,
                                    [d](const QModelIndex &parent, int start, int end, const QModelIndex &destination, int row) -> void {
                                        d->onRowsMoved(parent, start, end, destination, row);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::modelAboutToBeReset, [this]() -> void { beginResetModel(); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::modelReset, [d]() -> void { d->afterReset(); });
        const int sourceCols = sourceModel()->columnCount();
        const int sourceRows = sourceModel()->rowCount();
        for (int i = 0; i < sourceRows; ++i)
            d->m_extraData[0].append(RolesContainer());
        for (int i = 0; i < sourceCols; ++i)
            d->m_extraData[1].append(RolesContainer());
    }

    endResetModel();
}